

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall aeron::ClientConductor::releaseCounter(ClientConductor *this,int64_t registrationId)

{
  pointer pCVar1;
  int iVar2;
  pointer pCVar3;
  long lVar4;
  long lVar5;
  iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pCVar3 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pCVar1 - (long)pCVar3;
  lVar4 = (lVar5 >> 5) * -0x5555555555555555 >> 2;
  if (0 < lVar4) {
    lVar5 = lVar4 + 1;
    __position._M_current = pCVar3 + 2;
    do {
      if (__position._M_current[-2].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -2;
        goto LAB_00141445;
      }
      if (__position._M_current[-1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + -1;
        goto LAB_00141445;
      }
      if ((__position._M_current)->m_registrationId == registrationId) goto LAB_00141445;
      if (__position._M_current[1].m_registrationId == registrationId) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00141445;
      }
      lVar5 = lVar5 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar5);
    lVar5 = (long)pCVar1 - (long)(pCVar3 + lVar4 * 4);
    pCVar3 = pCVar3 + lVar4 * 4;
  }
  lVar4 = (lVar5 >> 5) * -0x5555555555555555;
  if (lVar4 == 1) {
LAB_00141426:
    __position._M_current = pCVar3;
    if (pCVar3->m_registrationId != registrationId) {
      __position._M_current = pCVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_0014141d:
    __position._M_current = pCVar3;
    if (pCVar3->m_registrationId != registrationId) {
      pCVar3 = pCVar3 + 1;
      goto LAB_00141426;
    }
  }
  else {
    if (lVar4 != 3) goto LAB_00141469;
    __position._M_current = pCVar3;
    if (pCVar3->m_registrationId != registrationId) {
      pCVar3 = pCVar3 + 1;
      goto LAB_0014141d;
    }
  }
LAB_00141445:
  if (__position._M_current != pCVar1) {
    DriverProxy::removeCounter(this->m_driverProxy,(__position._M_current)->m_registrationId);
    std::
    vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
    ::_M_erase(&this->m_counters,__position);
  }
LAB_00141469:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseCounter(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_counters.end())
    {
        m_driverProxy.removeCounter((*it).m_registrationId);

        m_counters.erase(it);
    }
}